

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInterface.cpp
# Opt level: O2

void __thiscall
Highs::formIllConditioningLp0
          (Highs *this,HighsLp *ill_conditioning_lp,vector<int,_std::allocator<int>_> *basic_var,
          bool constraint)

{
  HighsLp *pHVar1;
  vector<int,_std::allocator<int>_> *this_00;
  vector<double,_std::allocator<double>_> *this_01;
  vector<double,_std::allocator<double>_> *this_02;
  ulong uVar2;
  undefined7 in_register_00000009;
  pointer piVar3;
  HighsInt iRow;
  int iVar4;
  long lVar5;
  vector<int,_std::allocator<int>_> *this_03;
  long lVar6;
  long lVar7;
  vector<double,_std::allocator<double>_> *this_04;
  HighsInt ill_conditioning_lp_e_row;
  uint local_8c;
  double local_88;
  HighsLp *local_80;
  HighsSparseMatrix *local_78;
  int local_6c;
  vector<int,_std::allocator<int>_> *local_68;
  vector<double,_std::allocator<double>_> *local_60;
  vector<double,_std::allocator<double>_> *local_58;
  vector<double,_std::allocator<double>_> *local_50;
  vector<int,_std::allocator<int>_> *local_48;
  vector<double,_std::allocator<double>_> *local_40;
  vector<int,_std::allocator<int>_> *local_38;
  
  local_78 = (HighsSparseMatrix *)
             CONCAT44(local_78._4_4_,(int)CONCAT71(in_register_00000009,constraint));
  ill_conditioning_lp->num_row_ = (this->model_).lp_.num_row_ + 1;
  local_80 = ill_conditioning_lp;
  local_48 = basic_var;
  for (iVar4 = 0; iVar4 < (this->model_).lp_.num_row_; iVar4 = iVar4 + 1) {
    local_88 = 0.0;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>
              (&ill_conditioning_lp->row_lower_,&local_88);
    local_88 = 0.0;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>
              (&ill_conditioning_lp->row_upper_,&local_88);
  }
  local_88 = 1.0;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>
            (&ill_conditioning_lp->row_lower_,&local_88);
  local_88 = 1.0;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>
            (&ill_conditioning_lp->row_upper_,&local_88);
  HighsSparseMatrix::ensureColwise(&(this->model_).lp_.a_matrix_);
  local_6c = local_80->num_row_;
  (local_80->a_matrix_).num_row_ = local_6c;
  local_6c = local_6c + -1;
  local_50 = &local_80->col_cost_;
  local_58 = &local_80->col_lower_;
  local_60 = &local_80->col_upper_;
  this_03 = &(local_80->a_matrix_).index_;
  this_04 = &(local_80->a_matrix_).value_;
  local_68 = &(local_80->a_matrix_).start_;
  local_8c = 0;
  while( true ) {
    if ((this->model_).lp_.num_col_ <= (int)local_8c) break;
    if ((this->basis_).col_status.
        super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
        super__Vector_impl_data._M_start[(int)local_8c] == kBasic) {
      std::vector<int,_std::allocator<int>_>::push_back(local_48,(value_type_conflict2 *)&local_8c);
      local_88 = 0.0;
      std::vector<double,_std::allocator<double>_>::emplace_back<double>(local_50,&local_88);
      local_88 = -INFINITY;
      std::vector<double,_std::allocator<double>_>::emplace_back<double>(local_58,&local_88);
      std::vector<double,_std::allocator<double>_>::push_back
                (local_60,(value_type_conflict1 *)&kHighsInf);
      uVar2 = (ulong)(int)local_8c;
      piVar3 = (this->model_).lp_.a_matrix_.start_.super__Vector_base<int,_std::allocator<int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      lVar6 = (long)piVar3[uVar2];
      lVar7 = lVar6 * 4;
      lVar5 = lVar6 * 8;
      for (; lVar6 < piVar3[(long)(int)uVar2 + 1]; lVar6 = lVar6 + 1) {
        std::vector<int,_std::allocator<int>_>::push_back
                  (this_03,(value_type_conflict2 *)
                           ((long)(this->model_).lp_.a_matrix_.index_.
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start + lVar7));
        std::vector<double,_std::allocator<double>_>::push_back
                  (this_04,(value_type_conflict1 *)
                           ((long)(this->model_).lp_.a_matrix_.value_.
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_start + lVar5));
        uVar2 = (ulong)local_8c;
        piVar3 = (this->model_).lp_.a_matrix_.start_.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        lVar7 = lVar7 + 4;
        lVar5 = lVar5 + 8;
      }
      if ((char)local_78 == '\0') {
        std::vector<int,_std::allocator<int>_>::push_back(this_03,&local_6c);
        local_88 = 1.0;
        std::vector<double,_std::allocator<double>_>::emplace_back<double>(this_04,&local_88);
      }
      local_88 = (double)CONCAT44(local_88._4_4_,
                                  (int)((ulong)((long)(local_80->a_matrix_).index_.
                                                      super__Vector_base<int,_std::allocator<int>_>.
                                                      _M_impl.super__Vector_impl_data._M_finish -
                                               (long)(local_80->a_matrix_).index_.
                                                     super__Vector_base<int,_std::allocator<int>_>.
                                                     _M_impl.super__Vector_impl_data._M_start) >> 2)
                                 );
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(local_68,(int *)&local_88);
    }
    local_8c = local_8c + 1;
  }
  local_8c = 0;
  while( true ) {
    iVar4 = (this->model_).lp_.num_row_;
    if (iVar4 <= (int)local_8c) break;
    if ((this->basis_).row_status.
        super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
        super__Vector_impl_data._M_start[(int)local_8c] == kBasic) {
      local_88 = (double)CONCAT44(local_88._4_4_,local_8c + (this->model_).lp_.num_col_);
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(local_48,(int *)&local_88);
      local_88 = 0.0;
      std::vector<double,_std::allocator<double>_>::emplace_back<double>(local_50,&local_88);
      local_88 = -INFINITY;
      std::vector<double,_std::allocator<double>_>::emplace_back<double>(local_58,&local_88);
      std::vector<double,_std::allocator<double>_>::push_back
                (local_60,(value_type_conflict1 *)&kHighsInf);
      std::vector<int,_std::allocator<int>_>::push_back(this_03,(value_type_conflict2 *)&local_8c);
      local_88 = -1.0;
      std::vector<double,_std::allocator<double>_>::emplace_back<double>(this_04,&local_88);
      if ((char)local_78 == '\0') {
        std::vector<int,_std::allocator<int>_>::push_back(this_03,&local_6c);
        local_88 = 1.0;
        std::vector<double,_std::allocator<double>_>::emplace_back<double>(this_04,&local_88);
      }
      local_88 = (double)CONCAT44(local_88._4_4_,
                                  (int)((ulong)((long)(local_80->a_matrix_).index_.
                                                      super__Vector_base<int,_std::allocator<int>_>.
                                                      _M_impl.super__Vector_impl_data._M_finish -
                                               (long)(local_80->a_matrix_).index_.
                                                     super__Vector_base<int,_std::allocator<int>_>.
                                                     _M_impl.super__Vector_impl_data._M_start) >> 2)
                                 );
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(local_68,(int *)&local_88);
    }
    local_8c = local_8c + 1;
  }
  if ((char)local_78 != '\0') {
    local_78 = &local_80->a_matrix_;
    for (local_8c = 0; pHVar1 = local_80, (int)local_8c < iVar4; local_8c = local_8c + 1) {
      std::vector<int,_std::allocator<int>_>::push_back(this_03,(value_type_conflict2 *)&local_8c);
      local_88 = 1.0;
      std::vector<double,_std::allocator<double>_>::emplace_back<double>(this_04,&local_88);
      iVar4 = (this->model_).lp_.num_row_;
    }
    local_88 = (double)CONCAT44(local_88._4_4_,
                                (int)((ulong)((long)(local_80->a_matrix_).index_.
                                                    super__Vector_base<int,_std::allocator<int>_>.
                                                    _M_impl.super__Vector_impl_data._M_finish -
                                             (long)(local_80->a_matrix_).index_.
                                                   super__Vector_base<int,_std::allocator<int>_>.
                                                   _M_impl.super__Vector_impl_data._M_start) >> 2));
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(local_68,(int *)&local_88);
    iVar4 = (this->model_).lp_.num_row_;
    (pHVar1->a_matrix_).num_row_ = iVar4;
    (pHVar1->a_matrix_).num_col_ = iVar4 + 1;
    HighsSparseMatrix::ensureRowwise(local_78);
    (pHVar1->a_matrix_).format_ = kColwise;
  }
  this_02 = local_50;
  local_8c = 0;
  local_40 = this_04;
  local_38 = this_03;
  while( true ) {
    iVar4 = (this->model_).lp_.num_row_;
    if (iVar4 <= (int)local_8c) break;
    local_88 = 1.0;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>(this_02,&local_88);
    this_01 = local_58;
    local_88 = 0.0;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>(local_58,&local_88);
    std::vector<double,_std::allocator<double>_>::push_back
              (local_60,(value_type_conflict1 *)&kHighsInf);
    std::vector<int,_std::allocator<int>_>::push_back(this_03,(value_type_conflict2 *)&local_8c);
    local_88 = 1.0;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>(this_04,&local_88);
    this_00 = local_68;
    pHVar1 = local_80;
    local_88 = (double)CONCAT44(local_88._4_4_,
                                (int)((ulong)((long)(local_80->a_matrix_).index_.
                                                    super__Vector_base<int,_std::allocator<int>_>.
                                                    _M_impl.super__Vector_impl_data._M_finish -
                                             (long)(local_80->a_matrix_).index_.
                                                   super__Vector_base<int,_std::allocator<int>_>.
                                                   _M_impl.super__Vector_impl_data._M_start) >> 2));
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(local_68,(int *)&local_88);
    local_88 = 1.0;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>(this_02,&local_88);
    local_88 = 0.0;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>(this_01,&local_88);
    std::vector<double,_std::allocator<double>_>::push_back
              (local_60,(value_type_conflict1 *)&kHighsInf);
    std::vector<int,_std::allocator<int>_>::push_back(local_38,(value_type_conflict2 *)&local_8c);
    local_88 = -1.0;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>(local_40,&local_88);
    this_03 = local_38;
    this_04 = local_40;
    local_88 = (double)CONCAT44(local_88._4_4_,
                                (int)((ulong)((long)(pHVar1->a_matrix_).index_.
                                                    super__Vector_base<int,_std::allocator<int>_>.
                                                    _M_impl.super__Vector_impl_data._M_finish -
                                             (long)(pHVar1->a_matrix_).index_.
                                                   super__Vector_base<int,_std::allocator<int>_>.
                                                   _M_impl.super__Vector_impl_data._M_start) >> 2));
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_00,(int *)&local_88);
    local_8c = local_8c + 1;
  }
  iVar4 = iVar4 * 3;
  local_80->num_col_ = iVar4;
  (local_80->a_matrix_).num_col_ = iVar4;
  (local_80->a_matrix_).num_row_ = local_80->num_row_;
  return;
}

Assistant:

void Highs::formIllConditioningLp0(HighsLp& ill_conditioning_lp,
                                   std::vector<HighsInt>& basic_var,
                                   const bool constraint) {
  HighsLp& incumbent_lp = this->model_.lp_;
  // Conditioning LP minimizes the infeasibilities of
  //
  // [B^T]y = [0]; y free - for constraint view
  // [e^T]    [1]
  //
  // [ B ]y = [0]; y free - for column view
  // [e^T]    [1]
  //
  ill_conditioning_lp.num_row_ = incumbent_lp.num_row_ + 1;
  for (HighsInt iRow = 0; iRow < incumbent_lp.num_row_; iRow++) {
    ill_conditioning_lp.row_lower_.push_back(0);
    ill_conditioning_lp.row_upper_.push_back(0);
  }
  ill_conditioning_lp.row_lower_.push_back(1);
  ill_conditioning_lp.row_upper_.push_back(1);
  HighsSparseMatrix& incumbent_matrix = incumbent_lp.a_matrix_;
  incumbent_matrix.ensureColwise();
  HighsSparseMatrix& ill_conditioning_matrix = ill_conditioning_lp.a_matrix_;
  ill_conditioning_matrix.num_row_ = ill_conditioning_lp.num_row_;
  // Form the basis matrix and
  //
  // * For constraint view, add the column e, and transpose the
  // * resulting matrix
  //
  // * For column view, add a unit entry to each column
  //
  const HighsInt ill_conditioning_lp_e_row = ill_conditioning_lp.num_row_ - 1;
  for (HighsInt iCol = 0; iCol < incumbent_lp.num_col_; iCol++) {
    if (this->basis_.col_status[iCol] != HighsBasisStatus::kBasic) continue;
    // Basic column goes into conditioning LP, possibly with unit
    // coefficient for constraint e^Ty=1
    basic_var.push_back(iCol);
    ill_conditioning_lp.col_cost_.push_back(0);
    ill_conditioning_lp.col_lower_.push_back(-kHighsInf);
    ill_conditioning_lp.col_upper_.push_back(kHighsInf);
    for (HighsInt iEl = incumbent_matrix.start_[iCol];
         iEl < incumbent_matrix.start_[iCol + 1]; iEl++) {
      ill_conditioning_matrix.index_.push_back(incumbent_matrix.index_[iEl]);
      ill_conditioning_matrix.value_.push_back(incumbent_matrix.value_[iEl]);
    }
    if (!constraint) {
      ill_conditioning_matrix.index_.push_back(ill_conditioning_lp_e_row);
      ill_conditioning_matrix.value_.push_back(1.0);
    }
    ill_conditioning_matrix.start_.push_back(
        HighsInt(ill_conditioning_matrix.index_.size()));
  }
  for (HighsInt iRow = 0; iRow < incumbent_lp.num_row_; iRow++) {
    if (this->basis_.row_status[iRow] != HighsBasisStatus::kBasic) continue;
    // Basic slack goes into conditioning LP
    basic_var.push_back(incumbent_lp.num_col_ + iRow);
    ill_conditioning_lp.col_cost_.push_back(0);
    ill_conditioning_lp.col_lower_.push_back(-kHighsInf);
    ill_conditioning_lp.col_upper_.push_back(kHighsInf);
    ill_conditioning_matrix.index_.push_back(iRow);
    ill_conditioning_matrix.value_.push_back(-1.0);
    if (!constraint) {
      ill_conditioning_matrix.index_.push_back(ill_conditioning_lp_e_row);
      ill_conditioning_matrix.value_.push_back(1.0);
    }
    ill_conditioning_matrix.start_.push_back(
        HighsInt(ill_conditioning_matrix.index_.size()));
  }
  if (constraint) {
    // Add the column e, and transpose the resulting matrix
    for (HighsInt iRow = 0; iRow < incumbent_lp.num_row_; iRow++) {
      ill_conditioning_matrix.index_.push_back(iRow);
      ill_conditioning_matrix.value_.push_back(1.0);
    }
    ill_conditioning_matrix.start_.push_back(
        HighsInt(ill_conditioning_matrix.index_.size()));
    ill_conditioning_matrix.num_row_ = incumbent_lp.num_row_;
    ill_conditioning_matrix.num_col_ = incumbent_lp.num_row_ + 1;
    ill_conditioning_matrix.ensureRowwise();
    ill_conditioning_matrix.format_ = MatrixFormat::kColwise;
  }
  // Now add the variables to measure the infeasibilities
  for (HighsInt iRow = 0; iRow < incumbent_lp.num_row_; iRow++) {
    // Adding x_+ with cost 1
    ill_conditioning_lp.col_cost_.push_back(1);
    ill_conditioning_lp.col_lower_.push_back(0);
    ill_conditioning_lp.col_upper_.push_back(kHighsInf);
    ill_conditioning_matrix.index_.push_back(iRow);
    ill_conditioning_matrix.value_.push_back(1.0);
    ill_conditioning_matrix.start_.push_back(
        HighsInt(ill_conditioning_matrix.index_.size()));
    // Subtracting x_- with cost 1
    ill_conditioning_lp.col_cost_.push_back(1);
    ill_conditioning_lp.col_lower_.push_back(0);
    ill_conditioning_lp.col_upper_.push_back(kHighsInf);
    ill_conditioning_matrix.index_.push_back(iRow);
    ill_conditioning_matrix.value_.push_back(-1.0);
    ill_conditioning_matrix.start_.push_back(
        HighsInt(ill_conditioning_matrix.index_.size()));
  }
  ill_conditioning_lp.num_col_ = 3 * incumbent_lp.num_row_;
  ill_conditioning_matrix.num_col_ = ill_conditioning_lp.num_col_;
  ill_conditioning_matrix.num_row_ = ill_conditioning_lp.num_row_;
}